

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O3

void re2::AppendCCChar(string *t,Rune r)

{
  void *pvVar1;
  char *format;
  
  if (0x5e < r - 0x20U) {
    switch(r) {
    case 9:
      break;
    case 10:
      break;
    default:
      if (r < 0x100) {
        format = "\\x%02x";
      }
      else {
        format = "\\x{%x}";
      }
      StringAppendF(t,format,(ulong)(uint)r);
      return;
    case 0xc:
      break;
    case 0xd:
    }
    std::__cxx11::string::append((char *)t);
    return;
  }
  pvVar1 = memchr("[]^-\\",r,6);
  if (pvVar1 != (void *)0x0) {
    std::__cxx11::string::append((char *)t);
  }
  std::__cxx11::string::_M_replace_aux((ulong)t,t->_M_string_length,0,'\x01');
  return;
}

Assistant:

static void AppendCCChar(string* t, Rune r) {
  if (0x20 <= r && r <= 0x7E) {
    if (strchr("[]^-\\", r))
      t->append("\\");
    t->append(1, static_cast<char>(r));
    return;
  }
  switch (r) {
    default:
      break;

    case '\r':
      t->append("\\r");
      return;

    case '\t':
      t->append("\\t");
      return;

    case '\n':
      t->append("\\n");
      return;

    case '\f':
      t->append("\\f");
      return;
  }

  if (r < 0x100) {
    StringAppendF(t, "\\x%02x", static_cast<int>(r));
    return;
  }
  StringAppendF(t, "\\x{%x}", static_cast<int>(r));
}